

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O1

int __thiscall cppcms::http::impl::file_buffer::pbackfail(file_buffer *this,int param_1)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0xffffffff;
  if ((this->in_memory_ == false) && (lVar2 = this->read_offset_, lVar2 != 0)) {
    lVar4 = 0x200;
    if (lVar2 < 0x200) {
      lVar4 = lVar2;
    }
    lVar2 = (**(code **)(*(long *)this + 0x20))(this,lVar4 * -0x100000000 >> 0x20,1,8);
    if (-1 < lVar2) {
      iVar1 = (**(code **)(*(long *)this + 0x48))(this);
      if (-1 < iVar1) {
        lVar2 = *(long *)&this->field_0x10;
        lVar4 = (lVar4 << 0x20) + -0x100000000 >> 0x20;
        *(long *)&this->field_0x10 = lVar2 + lVar4;
        uVar3 = (uint)*(byte *)(lVar2 + lVar4);
      }
    }
  }
  return uVar3;
}

Assistant:

int pbackfail(int)
	{
		if(in_memory_)
			return -1;
		if(read_offset_ == 0)
			return -1;

		int by = buffer_size / 2;

		if(read_offset_ < by) 
			by = read_offset_;

		if(seekoff(-by,std::ios_base::cur,std::ios_base::in) < 0)
			return -1;
		if(underflow()  < 0)
			return -1;
		gbump(by - 1);
		return std::char_traits<char>::to_int_type(*gptr());
	}